

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

QGraphicsAnchor * __thiscall
QGraphicsAnchorLayoutPrivate::addAnchor
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *firstItem,AnchorPoint firstEdge,
          QGraphicsLayoutItem *secondItem,AnchorPoint secondEdge,qreal *spacing)

{
  long lVar1;
  bool bVar2;
  Orientation OVar3;
  Orientation OVar4;
  AnchorPoint AVar5;
  QGraphicsLayoutPrivate *firstItem_00;
  QGraphicsLayoutPrivate *this_00;
  AnchorData *data_00;
  QGraphicsLayoutPrivate *in_RCX;
  AnchorPoint in_EDX;
  QGraphicsLayoutPrivate *in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  AnchorPoint in_R8D;
  QGraphicsAnchorLayoutPrivate *in_R9;
  long in_FS_OFFSET;
  QGraphicsAnchor *graphicsAnchor;
  AnchorData *data;
  QGraphicsLayoutItem *parentWidget;
  QGraphicsAnchorLayout *q;
  QGraphicsLayoutItem **in_stack_fffffffffffffef8;
  AnchorData *in_stack_ffffffffffffff00;
  int line;
  QGraphicsLayoutItem **in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff20;
  QGraphicsLayoutItem *in_stack_ffffffffffffff28;
  QGraphicsAnchor *local_b0;
  char local_a8 [32];
  char local_88 [32];
  char local_68 [20];
  AnchorPoint in_stack_ffffffffffffffac;
  QGraphicsLayoutItem *in_stack_ffffffffffffffb0;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  firstItem_00 = (QGraphicsLayoutPrivate *)q_func(in_RDI);
  line = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  if ((in_RSI == (QGraphicsLayoutPrivate *)0x0) || (in_RCX == (QGraphicsLayoutPrivate *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08,line,(char *)in_stack_fffffffffffffef8);
    QMessageLogger::warning
              (&stack0xffffffffffffffb8,
               "QGraphicsAnchorLayout::addAnchor(): Cannot anchor NULL items");
    local_b0 = (QGraphicsAnchor *)0x0;
  }
  else if (in_RSI == in_RCX) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (char *)in_stack_ffffffffffffff08,line,(char *)in_stack_fffffffffffffef8);
    QMessageLogger::warning
              (local_68,"QGraphicsAnchorLayout::addAnchor(): Cannot anchor the item to itself");
    local_b0 = (QGraphicsAnchor *)0x0;
  }
  else {
    OVar3 = edgeOrientation(in_R8D);
    OVar4 = edgeOrientation(in_EDX);
    if (OVar3 == OVar4) {
      this_00 = (QGraphicsLayoutPrivate *)
                QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0x93da3f);
      if ((in_RSI == this_00) || (in_RCX == this_00)) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(OVar3,in_stack_ffffffffffffff10),
                   (char *)in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20)
                   ,(char *)in_stack_fffffffffffffef8);
        QMessageLogger::warning
                  (local_a8,
                   "QGraphicsAnchorLayout::addAnchor(): You cannot add the parent of the layout to the layout."
                  );
        local_b0 = (QGraphicsAnchor *)0x0;
      }
      else {
        if ((in_RSI != firstItem_00) &&
           (bVar2 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::contains<QGraphicsLayoutItem*>
                              ((QListSpecialMethodsBase<QGraphicsLayoutItem_*> *)
                               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), !bVar2)) {
          createItemEdges(in_stack_ffffffffffffff20,(QGraphicsLayoutItem *)in_RDI);
          QGraphicsLayoutPrivate::addChildLayoutItem(this_00,in_stack_ffffffffffffff28);
        }
        if ((in_RCX != firstItem_00) &&
           (bVar2 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::contains<QGraphicsLayoutItem*>
                              ((QListSpecialMethodsBase<QGraphicsLayoutItem_*> *)
                               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), !bVar2)) {
          createItemEdges(in_stack_ffffffffffffff20,(QGraphicsLayoutItem *)in_RDI);
          QGraphicsLayoutPrivate::addChildLayoutItem(this_00,in_stack_ffffffffffffff28);
        }
        AVar5 = (AnchorPoint)((ulong)this_00 >> 0x20);
        createCenterAnchors(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac);
        createCenterAnchors(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffac);
        correctEdgeDirection
                  (in_stack_ffffffffffffff20,(QGraphicsLayoutItem **)in_RDI,
                   (AnchorPoint *)CONCAT44(OVar3,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08,(AnchorPoint *)in_stack_ffffffffffffff00);
        data_00 = (AnchorData *)operator_new(0x80);
        QtGraphicsAnchorLayout::AnchorData::AnchorData(in_stack_ffffffffffffff00);
        local_b0 = acquireGraphicsAnchor
                             ((QGraphicsAnchorLayoutPrivate *)
                              CONCAT44(OVar3,in_stack_ffffffffffffff10),data_00);
        addAnchor_helper(in_R9,(QGraphicsLayoutItem *)firstItem_00,AVar5,
                         (QGraphicsLayoutItem *)data_00,(AnchorPoint)((ulong)local_b0 >> 0x20),
                         (AnchorData *)in_RDI);
        if (in_R9 == (QGraphicsAnchorLayoutPrivate *)0x0) {
          if ((((in_RSI == firstItem_00) || (in_RCX == firstItem_00)) ||
              (AVar5 = pickEdge(in_EDX,Horizontal), AVar5 == AnchorHorizontalCenter)) ||
             (AVar5 = oppositeEdge(in_EDX), AVar5 != in_R8D)) {
            QGraphicsAnchor::setSpacing
                      ((QGraphicsAnchor *)in_stack_ffffffffffffff00,(qreal)in_stack_fffffffffffffef8
                      );
          }
          else {
            QGraphicsAnchor::unsetSpacing((QGraphicsAnchor *)in_stack_ffffffffffffff00);
          }
        }
        else {
          QGraphicsAnchor::setSpacing
                    ((QGraphicsAnchor *)in_stack_ffffffffffffff00,(qreal)in_stack_fffffffffffffef8);
        }
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(OVar3,in_stack_ffffffffffffff10),
                 (char *)in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 (char *)in_stack_fffffffffffffef8);
      QMessageLogger::warning
                (local_88,
                 "QGraphicsAnchorLayout::addAnchor(): Cannot anchor edges of different orientations"
                );
      local_b0 = (QGraphicsAnchor *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

QGraphicsAnchor *QGraphicsAnchorLayoutPrivate::addAnchor(QGraphicsLayoutItem *firstItem,
                                                         Qt::AnchorPoint firstEdge,
                                                         QGraphicsLayoutItem *secondItem,
                                                         Qt::AnchorPoint secondEdge,
                                                         qreal *spacing)
{
    Q_Q(QGraphicsAnchorLayout);
    if ((firstItem == nullptr) || (secondItem == nullptr)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor NULL items");
        return nullptr;
    }

    if (firstItem == secondItem) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor the item to itself");
        return nullptr;
    }

    if (edgeOrientation(secondEdge) != edgeOrientation(firstEdge)) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "Cannot anchor edges of different orientations");
        return nullptr;
    }

    const QGraphicsLayoutItem *parentWidget = q->parentLayoutItem();
    if (firstItem == parentWidget || secondItem == parentWidget) {
        qWarning("QGraphicsAnchorLayout::addAnchor(): "
                 "You cannot add the parent of the layout to the layout.");
        return nullptr;
    }

    // In QGraphicsAnchorLayout, items are represented in its internal
    // graph as four anchors that connect:
    //  - Left -> HCenter
    //  - HCenter-> Right
    //  - Top -> VCenter
    //  - VCenter -> Bottom

    // Ensure that the internal anchors have been created for both items.
    if (firstItem != q && !items.contains(firstItem)) {
        createItemEdges(firstItem);
        addChildLayoutItem(firstItem);
    }
    if (secondItem != q && !items.contains(secondItem)) {
        createItemEdges(secondItem);
        addChildLayoutItem(secondItem);
    }

    // Create center edges if needed
    createCenterAnchors(firstItem, firstEdge);
    createCenterAnchors(secondItem, secondEdge);

    // Use heuristics to find out what the user meant with this anchor.
    correctEdgeDirection(firstItem, firstEdge, secondItem, secondEdge);

    AnchorData *data = new AnchorData;
    QGraphicsAnchor *graphicsAnchor = acquireGraphicsAnchor(data);

    addAnchor_helper(firstItem, firstEdge, secondItem, secondEdge, data);

    if (spacing) {
        graphicsAnchor->setSpacing(*spacing);
    } else {
        // If firstItem or secondItem is the layout itself, the spacing will default to 0.
        // Otherwise, the following matrix is used (questionmark means that the spacing
        // is queried from the style):
        //                from
        //  to      Left    HCenter Right
        //  Left    0       0       ?
        //  HCenter 0       0       0
        //  Right   ?       0       0
        if (firstItem == q
            || secondItem == q
            || pickEdge(firstEdge, Qt::Horizontal) == Qt::AnchorHorizontalCenter
            || oppositeEdge(firstEdge) != secondEdge) {
            graphicsAnchor->setSpacing(0);
        } else {
            graphicsAnchor->unsetSpacing();
        }
    }

    return graphicsAnchor;
}